

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

vector<DataElement,_std::allocator<DataElement>_> * __thiscall
Server::ReceiveDataVector
          (vector<DataElement,_std::allocator<DataElement>_> *__return_storage_ptr__,Server *this)

{
  int __fd;
  ssize_t sVar1;
  size_type __n;
  reference __buf;
  int local_30;
  int i;
  allocator<DataElement> local_1e;
  undefined1 local_1d;
  int local_1c;
  Server *pSStack_18;
  int size;
  Server *this_local;
  vector<DataElement,_std::allocator<DataElement>_> *V;
  
  pSStack_18 = this;
  this_local = (Server *)__return_storage_ptr__;
  sVar1 = recv(this->newsockfd,&local_1c,4,0);
  this->n = (int)sVar1;
  if (this->n < 0) {
    printf("ERROR in Server reading from Client\'s socket!\n");
  }
  local_1d = 0;
  __n = (size_type)local_1c;
  std::allocator<DataElement>::allocator(&local_1e);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            (__return_storage_ptr__,__n,&local_1e);
  std::allocator<DataElement>::~allocator(&local_1e);
  for (local_30 = 0; local_30 < local_1c; local_30 = local_30 + 1) {
    __fd = this->newsockfd;
    __buf = std::vector<DataElement,_std::allocator<DataElement>_>::operator[]
                      (__return_storage_ptr__,(long)local_30);
    sVar1 = recv(__fd,__buf,0x10,0);
    this->n = (int)sVar1;
    if (this->n < 0) {
      printf("ERROR in Server reading from Client\'s socket!\n");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<DataElement> Server::ReceiveDataVector()
{
    int size;
    n = recv(newsockfd, &size, sizeof(size), 0);
    if (n < 0)
        printf("ERROR in Server reading from Client's socket!\n");

    std::vector<DataElement> V(size);
    for (int i = 0; i < size; i++)
    {
        n = recv(newsockfd, &V[i], sizeof(V[i]), 0);
        if (n < 0)
            printf("ERROR in Server reading from Client's socket!\n");
    }
    return V;
}